

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.cpp
# Opt level: O2

int uv11::getaddrinfo(char *__name,char *__service,addrinfo *__req,addrinfo **__pai)

{
  int s;
  uv_loop_t *puVar1;
  error_code eVar2;
  
  std::function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)>::operator=
            ((function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)> *)
             (__service + 0xa8),
             (function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)> *)
             __req);
  puVar1 = Loop::Get((Loop *)__name);
  s = uv_getaddrinfo(puVar1,__service,getaddrinfo::anon_class_1_0_00000001::__invoke,__pai);
  eVar2 = make_error(s);
  return eVar2._M_value;
}

Assistant:

Error uv11::getaddrinfo(
    Loop& loop,
    GetAddrInfoRequest& req,
    GetAddrInfoCb const& callback,
    char const* node, char const* service,
    addrinfo& hints
) {
    req.getaddrinfo_cb = callback;
    int s = ::uv_getaddrinfo(
        &loop.Get(),
        &req.Get(),
        [](uv_getaddrinfo_t* req_ptr, int status, struct addrinfo* res){
            GetAddrInfoRequest* r = reinterpret_cast<GetAddrInfoRequest*>(req_ptr->data);
            r->getaddrinfo_cb(*r, make_error(status), UvAddrInfoPtr(res));
        },
        node, service,
        &hints
    );

    return make_error(s);
}